

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# debug.h
# Opt level: O0

String * kj::_::operator*(String *__return_storage_ptr__,char *param_2,undefined8 param_3,
                         undefined8 param_4,CappedArray<char,_14UL> *param_5)

{
  FixedArray<char,_1UL> *params;
  int *value;
  CappedArray<char,_14UL> local_40;
  _ local_21;
  char *local_20;
  DebugComparison<char,_int> *cmp_local;
  String *local_10;
  
  local_20 = param_2;
  local_10 = __return_storage_ptr__;
  local_21 = (_)tryToCharSequence<char,kj::FixedArray<char,1ul>>(param_2);
  params = (FixedArray<char,_1UL> *)(local_20 + 8);
  tryToCharSequence<int,kj::CappedArray<char,14ul>>(&local_40,(_ *)(local_20 + 4),value);
  concat<kj::FixedArray<char,1ul>,kj::StringPtr&,kj::CappedArray<char,14ul>>
            (__return_storage_ptr__,&local_21,params,(StringPtr *)&local_40,param_5);
  return __return_storage_ptr__;
}

Assistant:

String KJ_STRINGIFY(DebugComparison<Left, Right>& cmp) {
  return _::concat(tryToCharSequence(&cmp.left), cmp.op, tryToCharSequence(&cmp.right));
}